

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_StrNe_Test::
~iu_GTestSyntaxTest_x_iutest_x_StrNe_Test(iu_GTestSyntaxTest_x_iutest_x_StrNe_Test *this)

{
  iu_GTestSyntaxTest_x_iutest_x_StrNe_Test *this_local;
  
  iutest::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(GTestSyntaxTest, StrNe)
{
    const char test[] = "Test";
    if( const char* p = "test" )
        ASSERT_STRNE(p, test) << p;
    if( const char* p = "test" )
        EXPECT_STRNE(p, test) << p;
    if( const char* p = "test" )
        INFORM_STRNE(p, test) << p;
    if( const char* p = "test" )
        ASSUME_STRNE(p, test) << p;
}